

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O1

Value * __thiscall cmFileAPI::AddReplyIndexObject(cmFileAPI *this,Object *o)

{
  bool bVar1;
  mapped_type *this_00;
  Value *pVVar2;
  Value *pVVar3;
  Object *o_00;
  string local_b0;
  string local_90;
  Value local_70;
  Value local_48;
  
  this_00 = std::
            map<cmFileAPI::Object,_Json::Value,_std::less<cmFileAPI::Object>,_std::allocator<std::pair<const_cmFileAPI::Object,_Json::Value>_>_>
            ::operator[](&this->ReplyIndexObjects,o);
  bVar1 = Json::Value::isNull(this_00);
  if (bVar1) {
    BuildObject(&local_70,this,o);
    bVar1 = Json::Value::isObject(&local_70);
    if (!bVar1) {
      __assert_fail("object.isObject()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmFileAPI.cxx"
                    ,0x1af,"const Json::Value &cmFileAPI::AddReplyIndexObject(const Object &)");
    }
    Json::Value::Value(&local_48,objectValue);
    Json::Value::operator=(this_00,&local_48);
    Json::Value::~Value(&local_48);
    pVVar2 = Json::Value::operator[](&local_70,"kind");
    pVVar3 = Json::Value::operator[](this_00,"kind");
    Json::Value::operator=(pVVar3,pVVar2);
    pVVar2 = Json::Value::operator[](&local_70,"version");
    pVVar3 = Json::Value::operator[](this_00,"version");
    Json::Value::operator=(pVVar3,pVVar2);
    ObjectName_abi_cxx11_(&local_b0,(cmFileAPI *)o,o_00);
    WriteJsonFile(&local_90,this,&local_70,&local_b0,ComputeSuffixHash);
    Json::Value::Value(&local_48,&local_90);
    pVVar2 = Json::Value::operator[](this_00,"jsonFile");
    Json::Value::operator=(pVVar2,&local_48);
    Json::Value::~Value(&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    Json::Value::~Value(&local_70);
  }
  return this_00;
}

Assistant:

Json::Value const& cmFileAPI::AddReplyIndexObject(Object const& o)
{
  Json::Value& indexEntry = this->ReplyIndexObjects[o];
  if (!indexEntry.isNull()) {
    // The reply object has already been generated.
    return indexEntry;
  }

  // Generate this reply object.
  Json::Value const& object = this->BuildObject(o);
  assert(object.isObject());

  // Populate this index entry.
  indexEntry = Json::objectValue;
  indexEntry["kind"] = object["kind"];
  indexEntry["version"] = object["version"];
  indexEntry["jsonFile"] = this->WriteJsonFile(object, ObjectName(o));
  return indexEntry;
}